

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.h
# Opt level: O3

bool flatbuffers::anon_unknown_101::VerifyVectorOfStructs
               (Verifier *v,Table *parent_table,voffset_t field_offset,Object *obj,bool required)

{
  bool bVar1;
  ulong uVar2;
  size_t elem_size;
  
  if ((field_offset < *(ushort *)(parent_table + -(long)*(int *)parent_table)) &&
     (uVar2 = (ulong)*(ushort *)(parent_table + ((ulong)field_offset - (long)*(int *)parent_table)),
     uVar2 != 0)) {
    if ((*(ushort *)(obj + -(long)*(int *)obj) < 0xd) ||
       ((ulong)*(ushort *)(obj + (0xc - (long)*(int *)obj)) == 0)) {
      elem_size = 0;
    }
    else {
      elem_size = (size_t)*(int *)(obj + *(ushort *)(obj + (0xc - (long)*(int *)obj)));
    }
    bVar1 = VerifierTemplate<false>::VerifyVectorOrString<unsigned_int>
                      (v,(uint8_t *)(parent_table + *(uint *)(parent_table + uVar2) + uVar2),
                       elem_size,(size_t *)0x0);
    return bVar1;
  }
  return !required;
}

Assistant:

T ReadScalar(const void *p) {
  return EndianScalar(*reinterpret_cast<const T *>(p));
}